

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

UObject * __thiscall
icu_63::BasicCalendarFactory::create
          (BasicCalendarFactory *this,ICUServiceKey *key,ICUService *param_2,UErrorCode *status)

{
  UBool UVar1;
  ECalType calType;
  undefined1 local_2e8 [8];
  UnicodeString str;
  char keyword [157];
  undefined1 local_1f8 [8];
  Locale canLoc;
  Locale curLoc;
  LocaleKey *lkey;
  UErrorCode *status_local;
  ICUService *param_2_local;
  ICUServiceKey *key_local;
  BasicCalendarFactory *this_local;
  
  Locale::Locale((Locale *)&canLoc.fIsBogus);
  Locale::Locale((Locale *)local_1f8);
  (*(key->super_UObject)._vptr_UObject[0xc])(key,&canLoc.fIsBogus);
  (*(key->super_UObject)._vptr_UObject[0xb])(key,local_1f8);
  UnicodeString::UnicodeString((UnicodeString *)local_2e8);
  (*(key->super_UObject)._vptr_UObject[5])(key,local_2e8);
  getCalendarKeyword((UnicodeString *)local_2e8,(char *)(str.fUnion.fStackFields.fBuffer + 0x17),
                     0x9d);
  UVar1 = isStandardSupportedKeyword((char *)(str.fUnion.fStackFields.fBuffer + 0x17),status);
  if (UVar1 == '\0') {
    this_local = (BasicCalendarFactory *)0x0;
  }
  else {
    calType = getCalendarType((char *)(str.fUnion.fStackFields.fBuffer + 0x17));
    this_local = (BasicCalendarFactory *)createStandardCalendar(calType,(Locale *)local_1f8,status);
  }
  UnicodeString::~UnicodeString((UnicodeString *)local_2e8);
  Locale::~Locale((Locale *)local_1f8);
  Locale::~Locale((Locale *)&canLoc.fIsBogus);
  return (UObject *)this_local;
}

Assistant:

virtual UObject* create(const ICUServiceKey& key, const ICUService* /*service*/, UErrorCode& status) const {
#ifdef U_DEBUG_CALSVC
        if(dynamic_cast<const LocaleKey*>(&key) == NULL) {
            fprintf(stderr, "::create - not a LocaleKey!\n");
        }
#endif
        const LocaleKey& lkey = (LocaleKey&)key;
        Locale curLoc;  // current locale
        Locale canLoc;  // Canonical locale

        lkey.currentLocale(curLoc);
        lkey.canonicalLocale(canLoc);

        char keyword[ULOC_FULLNAME_CAPACITY];
        UnicodeString str;

        key.currentID(str);
        getCalendarKeyword(str, keyword, (int32_t) sizeof(keyword));

#ifdef U_DEBUG_CALSVC
        fprintf(stderr, "BasicCalendarFactory::create() - cur %s, can %s\n", (const char*)curLoc.getName(), (const char*)canLoc.getName());
#endif

        if(!isStandardSupportedKeyword(keyword,status)) {  // Do we handle this type?
#ifdef U_DEBUG_CALSVC

            fprintf(stderr, "BasicCalendarFactory - not handling %s.[%s]\n", (const char*) curLoc.getName(), tmp );
#endif
            return NULL;
        }

        return createStandardCalendar(getCalendarType(keyword), canLoc, status);
    }